

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-x11.c
# Opt level: O2

errr Term_text_x11(wchar_t x,wchar_t y,wchar_t n,wchar_t a,wchar_t *s)

{
  void *pvVar1;
  size_t sVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  
  sVar2 = (size_t)(uint)n;
  Infoclr = clr[a % 0x20 + (a / 0x100) * 0x20];
  if ((s != (wchar_t *)0x0) && (*s != L'\0')) {
    pvVar1 = Term->data;
    if (n < L'\0') {
      sVar2 = wcslen(s);
    }
    iVar4 = (int)Infowin->oy + y * *(int *)((long)pvVar1 + 0xf0);
    iVar3 = (int)Infowin->ox + x * *(int *)((long)pvVar1 + 0xe8);
    XFillRectangle(metadpy_default_0,Infowin->win,clr[0]->gc,iVar3,iVar4,
                   *(int *)((long)pvVar1 + 0xe8) * (int)sVar2,*(int *)((long)pvVar1 + 0xf0));
    iVar4 = Infofnt->asc + iVar4;
    if ((Infofnt->field_0x19 & 1) == 0) {
      XwcDrawImageString(metadpy_default_0,Infowin->win,Infofnt->fs,Infoclr->gc,iVar3,iVar4,s,sVar2)
      ;
    }
    else {
      uVar5 = 0;
      uVar6 = sVar2 & 0xffffffff;
      if ((int)sVar2 < 1) {
        uVar6 = 0;
      }
      for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
        XwcDrawImageString(metadpy_default_0,Infowin->win,Infofnt->fs,Infoclr->gc,
                           (uint)Infofnt->off + *(int *)((long)pvVar1 + 0xe8) * (int)uVar5 + iVar3,
                           iVar4,s,1);
        s = s + 1;
      }
    }
  }
  return 0;
}

Assistant:

static errr Term_text_x11(int x, int y, int n, int a, const wchar_t *s)
{
	/* Draw the text */
	Infoclr_set(clr[(a / MULT_BG) * MAX_COLORS + (a % MAX_COLORS)]);

	/* Draw the text */
	Infofnt_text_std(x, y, s, n);

	/* Success */
	return (0);
}